

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O2

CATNNode<unsigned_char> * __thiscall
Centaurus::CompositeATN<unsigned_char>::get_node(CompositeATN<unsigned_char> *this,ATNPath *path)

{
  mapped_type *this_00;
  CATNNode<unsigned_char> *pCVar1;
  
  this_00 = std::__detail::
            _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::at((_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&this->m_dict,
                 &(path->
                  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                  ).
                  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].first);
  pCVar1 = CATNMachine<unsigned_char>::operator[]
                     (this_00,(path->
                              super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                              ).
                              super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].second);
  return pCVar1;
}

Assistant:

const CATNNode<TCHAR>& get_node(const ATNPath& path) const
    {
        return m_dict.at(path.leaf_id())[path.leaf_index()];
    }